

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall wabt::interp::Thread::PushCall(Thread *this,HostFunc *func,Ptr *out_trap)

{
  Store *store;
  RunResult RVar1;
  int local_6c;
  Ptr local_68;
  string local_48;
  
  if ((this->frames_).super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (this->frames_).super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    store = this->store_;
    std::__cxx11::string::string((string *)&local_48,"call stack exhausted",(allocator *)&local_6c);
    Trap::New(&local_68,store,&local_48,&this->frames_);
    out_trap->obj_ = local_68.obj_;
    out_trap->store_ = local_68.store_;
    out_trap->root_index_ = local_68.root_index_;
    local_68.obj_ = (Trap *)0x0;
    local_68.store_ = (Store *)0x0;
    local_68.root_index_ = 0;
    RefPtr<wabt::interp::Trap>::reset(&local_68);
    std::__cxx11::string::_M_dispose();
    RVar1 = Trap;
  }
  else {
    this->inst_ = (Instance *)0x0;
    this->mod_ = (Module *)0x0;
    local_48._M_dataplus._M_p = (pointer)(func->super_Func).super_Extern.super_Object.self_.index;
    local_68.obj_ =
         (Trap *)(((long)(this->values_).
                         super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->values_).
                        super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18);
    local_6c = 0;
    std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>::
    emplace_back<wabt::interp::Ref,unsigned_long,int,wabt::interp::Instance*&,wabt::interp::Module*&>
              ((vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>> *)&this->frames_,
               (Ref *)&local_48,(unsigned_long *)&local_68,&local_6c,&this->inst_,&this->mod_);
    RVar1 = Ok;
  }
  return RVar1;
}

Assistant:

RunResult Thread::PushCall(const HostFunc& func, Trap::Ptr* out_trap) {
  TRAP_IF(frames_.size() == frames_.capacity(), "call stack exhausted");
  inst_ = nullptr;
  mod_ = nullptr;
  frames_.emplace_back(func.self(), values_.size(), 0, inst_, mod_);
  return RunResult::Ok;
}